

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O1

void __thiscall AST::ASTBuilder::insertRightChild(ASTBuilder *this)

{
  stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_> *this_00;
  iterator *piVar1;
  ASTNode *node;
  _Elt_pointer ppAVar2;
  value_type A;
  ASTNode *local_20;
  
  this_00 = &this->stack;
  ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar2 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  node = ppAVar2[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar2 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_20 = ppAVar2[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  ASTNode::addChildToRight(local_20,node);
  ppAVar2 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar2 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<AST::ASTNode*,std::allocator<AST::ASTNode*>>::_M_push_back_aux<AST::ASTNode*const&>
              ((deque<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)this_00,&local_20);
  }
  else {
    *ppAVar2 = local_20;
    piVar1 = &(this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void AST::ASTBuilder::insertRightChild() {
    auto B = stack.top();
    stack.pop();
    auto A = stack.top();
    stack.pop();
    A->addChildToRight(B);
    stack.push(A);
}